

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnWcsicmp_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnWcsicmp_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *val2;
  type **in_stack_fffffffffffff5b8;
  AssertionHelper local_9a8;
  Fixed local_978;
  int local_7f0;
  char local_7ec [4];
  undefined1 local_7e8 [8];
  AssertionResult iutest_ar_4;
  Fixed local_790;
  int local_608;
  char local_604 [4];
  undefined1 local_600 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5a8;
  int local_420;
  char local_41c [4];
  undefined1 local_418 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c0;
  int local_238;
  char local_234 [4];
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1d8;
  int local_40;
  char local_3c [4];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_UnitStringTest_x_iutest_x_OwnWcsicmp_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c[0] = '\0';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  local_40 = iutest::detail::wrapper::iu_wcsicmp(L"AAA",L"aaa");
  val2 = (int *)&iutest_type_traits::enabler_t<void>::value;
  iutest::internal::backward::EqHelper<true>::Compare<int,int>
            ((AssertionResult *)local_38,(EqHelper<true> *)0x1c9d22,
             "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", L\"aaa\")",local_3c,&local_40,
             (int *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffff5b8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x4f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_234[0] = '\0';
  local_234[1] = '\0';
  local_234[2] = '\0';
  local_234[3] = '\0';
  local_238 = iutest::detail::wrapper::iu_wcsicmp(L"AAAa",L"aaa");
  iutest::internal::CmpHelperLT<int,int>
            ((AssertionResult *)local_230,(internal *)0x1c9d22,
             "::iutest::detail::wrapper::iu_wcsicmp(L\"AAAa\", L\"aaa\")",local_234,&local_238,val2)
  ;
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x50,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  iutest::detail::AlwaysZero();
  local_41c[0] = '\0';
  local_41c[1] = '\0';
  local_41c[2] = '\0';
  local_41c[3] = '\0';
  local_420 = iutest::detail::wrapper::iu_wcsicmp(L"AAAB",L"aaaa");
  iutest::internal::CmpHelperLT<int,int>
            ((AssertionResult *)local_418,(internal *)0x1c9d22,
             "::iutest::detail::wrapper::iu_wcsicmp(L\"AAAB\", L\"aaaa\")",local_41c,&local_420,val2
            );
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    memset(&local_5a8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_418);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x51,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5a8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  iutest::detail::AlwaysZero();
  local_604[0] = '\0';
  local_604[1] = '\0';
  local_604[2] = '\0';
  local_604[3] = '\0';
  local_608 = iutest::detail::wrapper::iu_wcsicmp(L"AAAa",L"aaaB");
  iutest::internal::CmpHelperGT<int,int>
            ((AssertionResult *)local_600,(internal *)0x1c9d22,
             "::iutest::detail::wrapper::iu_wcsicmp(L\"AAAa\", L\"aaaB\")",local_604,&local_608,val2
            );
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    memset(&local_790,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_790);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_600);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x52,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_790);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_790);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  iutest::detail::AlwaysZero();
  local_7ec[0] = '\0';
  local_7ec[1] = '\0';
  local_7ec[2] = '\0';
  local_7ec[3] = '\0';
  local_7f0 = iutest::detail::wrapper::iu_wcsicmp(L"AAA",L"aaaA");
  iutest::internal::CmpHelperGT<int,int>
            ((AssertionResult *)local_7e8,(internal *)0x1c9d22,
             "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", L\"aaaA\")",local_7ec,&local_7f0,val2)
  ;
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    memset(&local_978,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_978);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7e8);
    iutest::AssertionHelper::AssertionHelper
              (&local_9a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x53,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_9a8,&local_978);
    iutest::AssertionHelper::~AssertionHelper(&local_9a8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_978);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnWcsicmp)
{
    IUTEST_EXPECT_EQ(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", L"aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAAa", L"aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAAB", L"aaaa"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAAa", L"aaaB"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", L"aaaA"));
}